

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::ParseGoogleTestFlagsOnly(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **ppcVar3;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  uint uVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined1 auStack_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  auStack_70._0_8_ = auStack_70 + 0x10;
  auStack_70._8_8_ = 0;
  auStack_70[0x10] = '\0';
  uVar5 = argc;
  if (1 < *argc) {
    uVar6 = 1;
    do {
      StreamableToString<char*>((string *)&aStack_50,(internal *)(argv + (int)uVar6),in_RDX);
      uVar5 = aStack_50._M_allocated_capacity;
      bVar1 = ParseGoogleTestFlag((char *)aStack_50._M_allocated_capacity);
      in_RDX = extraout_RDX;
      if (bVar1) {
LAB_00295168:
        iVar2 = *argc;
        if ((int)(uVar6 + 1) < iVar2) {
          ppcVar3 = argv + (int)(uVar6 + 1);
          in_RDX = (char **)(ulong)(iVar2 - 1U);
          uVar4 = uVar6;
          do {
            argv[(int)uVar4] = *ppcVar3;
            uVar4 = uVar4 + 1;
            ppcVar3 = ppcVar3 + 1;
          } while (iVar2 - 1U != uVar4);
        }
        *argc = iVar2 + -1;
        argv[(long)iVar2 + -1] = (char *)0x0;
        uVar6 = uVar6 - 1;
      }
      else {
        bVar1 = ParseFlag<std::__cxx11::string>
                          ((char *)uVar5,"flagfile",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_70);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_flagfile_abi_cxx11_);
          LoadFlagsFromFile((string *)auStack_70._0_8_);
          in_RDX = extraout_RDX_00;
          goto LAB_00295168;
        }
        iVar2 = std::__cxx11::string::compare(aStack_50._M_local_buf);
        in_RDX = extraout_RDX_02;
        if ((iVar2 == 0) ||
           (bVar1 = HasGoogleTestFlagPrefix((char *)0x2951e7), in_RDX = extraout_RDX_03, bVar1)) {
          g_help_flag = '\x01';
        }
      }
      uVar5 = aStack_50._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)aStack_50._M_allocated_capacity != &aStack_40) {
        operator_delete((void *)aStack_50._M_allocated_capacity,aStack_40._M_allocated_capacity + 1)
        ;
        in_RDX = extraout_RDX_01;
      }
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded((char *)uVar5);
  }
  if ((string *)auStack_70._0_8_ != (string *)(auStack_70 + 0x10)) {
    operator_delete((void *)auStack_70._0_8_,CONCAT71(auStack_70._17_7_,auStack_70[0x10]) + 1);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnly(int* argc, char** argv) {
#ifdef GTEST_HAS_ABSL_FLAGS
  if (*argc <= 0) return;

  std::vector<char*> positional_args;
  std::vector<absl::UnrecognizedFlag> unrecognized_flags;
  absl::ParseAbseilFlagsOnly(*argc, argv, positional_args, unrecognized_flags);
  absl::flat_hash_set<absl::string_view> unrecognized;
  for (const auto& flag : unrecognized_flags) {
    unrecognized.insert(flag.flag_name);
  }
  absl::flat_hash_set<char*> positional;
  for (const auto& arg : positional_args) {
    positional.insert(arg);
  }

  int out_pos = 1;
  int in_pos = 1;
  for (; in_pos < *argc; ++in_pos) {
    char* arg = argv[in_pos];
    absl::string_view arg_str(arg);
    if (absl::ConsumePrefix(&arg_str, "--")) {
      // Flag-like argument. If the flag was unrecognized, keep it.
      // If it was a GoogleTest flag, remove it.
      if (unrecognized.contains(arg_str)) {
        argv[out_pos++] = argv[in_pos];
        continue;
      }
    }

    if (arg_str.empty()) {
      ++in_pos;
      break;  // '--' indicates that the rest of the arguments are positional
    }

    // Probably a positional argument. If it is in fact positional, keep it.
    // If it was a value for the flag argument, remove it.
    if (positional.contains(arg)) {
      argv[out_pos++] = arg;
    }
  }

  // The rest are positional args for sure.
  while (in_pos < *argc) {
    argv[out_pos++] = argv[in_pos++];
  }

  *argc = out_pos;
  argv[out_pos] = nullptr;
#else
  ParseGoogleTestFlagsOnlyImpl(argc, argv);
#endif

  // Fix the value of *_NSGetArgc() on macOS, but if and only if
  // *_NSGetArgv() == argv
  // Only applicable to char** version of argv
#ifdef GTEST_OS_MAC
#ifndef GTEST_OS_IOS
  if (*_NSGetArgv() == argv) {
    *_NSGetArgc() = *argc;
  }
#endif
#endif
}